

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O2

void __thiscall CTcTokenizer::pragma_message(CTcTokenizer *this)

{
  EVP_PKEY_CTX *dst;
  int iVar1;
  tc_toktyp_t tVar2;
  CTcTokenizer *this_00;
  EVP_PKEY_CTX *src;
  
  dst = (EVP_PKEY_CTX *)(this->linebuf_).buf_;
  src = (EVP_PKEY_CTX *)((this->curtok_).text_ + ((this->curtok_).text_len_ - (long)dst));
  CTcTokString::copy(&this->expbuf_,dst,src);
  iVar1 = expand_macros_curline(this,0,0,1);
  if (iVar1 == 0) {
    if ((undefined1  [3440])((undefined1  [3440])*this & (undefined1  [3440])0x14) !=
        (undefined1  [3440])0x0) {
      CTcTokString::copy(&this->linebuf_,(EVP_PKEY_CTX *)(this->expbuf_).buf_,
                         (EVP_PKEY_CTX *)(this->expbuf_).buf_len_);
      return;
    }
    this->curbuf_ = &this->expbuf_;
    (this->p_).p_ = (this->expbuf_).buf_ + (int)src;
    tVar2 = next_on_line_xlat(this,(tok_embed_ctx *)0x0);
    if (tVar2 == TOKT_LPAR) {
      this_00 = this;
      next_on_line_xlat(this,(tok_embed_ctx *)0x0);
    }
    else {
      this_00 = (CTcTokenizer *)0x271f;
      log_warning(0x271f);
    }
    do {
      tVar2 = (this->curtok_).typ_;
      switch(tVar2) {
      case TOKT_SYM:
      case TOKT_SSTR:
      case TOKT_DSTR:
        msg_str(this_00,(this->curtok_).text_,(this->curtok_).text_len_);
        break;
      case TOKT_INT:
        msg_long(this_00,(this->curtok_).int_val_);
        break;
      case TOKT_SSTR_START:
      case TOKT_SSTR_MID:
      case TOKT_SSTR_END:
        break;
      default:
        if ((tVar2 == TOKT_EOF) || (tVar2 == TOKT_RPAR)) goto LAB_0021d2be;
      }
      this_00 = this;
      next_on_line_xlat(this,(tok_embed_ctx *)0x0);
    } while( true );
  }
LAB_0021d1f7:
  clear_linebuf(this);
  return;
LAB_0021d2be:
  msg_str(this_00,"\n",1);
  goto LAB_0021d1f7;
}

Assistant:

void CTcTokenizer::pragma_message()
{
    size_t startofs;

    /* 
     *   copy the source line through the "message" token to the macro
     *   expansion buffer - we don't want to expand that part, but we want
     *   it to appear in the expansion, so just copy the original 
     */
    startofs = (curtok_.get_text() + curtok_.get_text_len()
                - linebuf_.get_text());
    expbuf_.copy(linebuf_.get_text(), startofs);

    /* expand macros; don't allow reading additional lines */
    if (expand_macros_curline(FALSE, FALSE, TRUE))
    {
        clear_linebuf();
        return;
    }

    /* 
     *   If we're in normal compilation mode, display the message.  If we're
     *   in preprocess-only mode, simply retain the message in the
     *   preprocessed result, so that it shows up when the result is
     *   compiled.  
     *   
     *   Ignore messages in list-includes mode.  
     */
    if (!pp_only_mode_ && !list_includes_mode_)
    {
        /* set up at the first post-processed token */
        start_new_line(&expbuf_, startofs);

        /* if there's an open paren, skip it */
        if (next_on_line_xlat(0) == TOKT_LPAR)
            next_on_line_xlat(0);
        else
            log_warning(TCERR_BAD_PRAGMA_SYNTAX);

        /* keep going until we reach the closing paren */
        while (curtok_.gettyp() != TOKT_RPAR
               && curtok_.gettyp() != TOKT_EOF)
        {
            /* display this token */
            switch(curtok_.gettyp())
            {
            case TOKT_SSTR:
            case TOKT_DSTR:
            case TOKT_SYM:
                /* display the text of the token */
                msg_str(curtok_.get_text(), curtok_.get_text_len());
                break;

            case TOKT_INT:
                /* display the integer */
                msg_long(curtok_.get_int_val());
                break;

            default:
                /* ignore anything else */
                break;
            }

            /* get the next token */
            next_on_line_xlat(0);
        }

        /* end the line */
        msg_str("\n", 1);
        
        /* remove the message from the result text */
        clear_linebuf();
    }
    else
    {
        /* preprocessing - copy expanded text to line buffer */
        linebuf_.copy(expbuf_.get_text(), expbuf_.get_text_len());
    }
}